

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_decl.h
# Opt level: O1

uint32_t google::protobuf::internal::TcParseTableBase::TagToIdx
                   (uint32_t tag,uint32_t fast_table_size)

{
  Nonnull<const_char_*> pcVar1;
  uint uVar2;
  
  uVar2 = fast_table_size & fast_table_size - 1;
  if (uVar2 == 0) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((ulong)uVar2,0,"(fast_table_size & (fast_table_size - 1)) == uint32_t{0}");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    return fast_table_size - 1 & tag >> 3;
  }
  TagToIdx();
}

Assistant:

static uint32_t TagToIdx(uint32_t tag, uint32_t fast_table_size) {
    // The fast table size must be a power of two.
    ABSL_DCHECK_EQ((fast_table_size & (fast_table_size - 1)), uint32_t{0});

    // The field index is determined by the low bits of the field number, where
    // the table size determines the width of the mask. The largest table
    // supported is 32 entries. The parse loop uses these bits directly, so that
    // the dispatch does not require arithmetic:
    //        byte 0   byte 1
    //   tag: 1nnnnttt 0nnnnnnn
    //        ^^^^^
    //         idx (table_size_log2=5)
    // This means that any field number that does not fit in the lower 4 bits
    // will always have the top bit of its table index asserted.
    uint32_t idx_mask = fast_table_size - 1;
    return (tag >> 3) & idx_mask;
  }